

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_cdn_monitor_data.cc
# Opt level: O0

void anon_unknown.dwarf_2545c::Json2Type(Value *value,CdnDescribeCdnMonitorDataResponseType *item)

{
  bool bVar1;
  Int IVar2;
  Value *pVVar3;
  Json2Array<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType> local_79;
  string local_78;
  string local_58;
  string local_38;
  CdnDescribeCdnMonitorDataResponseType *local_18;
  CdnDescribeCdnMonitorDataResponseType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (CdnDescribeCdnMonitorDataResponseType *)value;
  bVar1 = Json::Value::isMember(value,"DomainName");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DomainName");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->domain_name,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"MonitorInterval");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"MonitorInterval");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->monitor_interval = (long)IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"StartTime");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"StartTime");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->start_time,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"EndTime");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"EndTime");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->end_time,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"MonitorDatas");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"MonitorDatas");
    bVar1 = Json::Value::isMember(pVVar3,"CDNMonitorData");
    if (bVar1) {
      pVVar3 = Json::Value::operator[]((Value *)item_local,"MonitorDatas");
      pVVar3 = Json::Value::operator[](pVVar3,"CDNMonitorData");
      Json2Array<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType>::Json2Array
                (&local_79,pVVar3,&local_18->monitor_datas);
    }
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, CdnDescribeCdnMonitorDataResponseType* item) {
  if(value.isMember("DomainName")) {
    item->domain_name = value["DomainName"].asString();
  }
  if(value.isMember("MonitorInterval")) {
    item->monitor_interval = value["MonitorInterval"].asInt();
  }
  if(value.isMember("StartTime")) {
    item->start_time = value["StartTime"].asString();
  }
  if(value.isMember("EndTime")) {
    item->end_time = value["EndTime"].asString();
  }
  if(value.isMember("MonitorDatas") && value["MonitorDatas"].isMember("CDNMonitorData")) {
    Json2Array<CdnDescribeCdnMonitorDataCDNMonitorDataType>(value["MonitorDatas"]["CDNMonitorData"], &item->monitor_datas);
  }
}